

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfoMB *
embree::sse2::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,mvector<SubGridBuildData> *sgrids,
          BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  float fVar1;
  Geometry *pGVar2;
  Ref<embree::Geometry> *pRVar3;
  float fVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  size_t sVar7;
  BBox1f BVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  task *ptVar12;
  unsigned_long uVar13;
  runtime_error *prVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  long lVar18;
  size_t sVar19;
  float *pfVar20;
  _func_int **pp_Var21;
  size_t sVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  _func_int **pp_Var29;
  bool bVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  float fVar42;
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  BBox1f BVar45;
  BBox1f BVar46;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e31;
  _func_int **local_4e30;
  BBox1f local_4e28;
  long **local_4e20;
  task_traits local_4e18;
  mvector<PrimRefMB> *local_4e10;
  mvector<SubGridBuildData> *local_4e08;
  Scene **local_4e00;
  size_t local_4df8;
  mvector<PrimRefMB> **local_4df0;
  Scene **local_4de8;
  Scene *local_4de0;
  GTypeMask local_4dd8;
  undefined1 local_4dd0;
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined8 local_4db8;
  undefined8 uStack_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  undefined8 local_4d88;
  undefined8 uStack_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  unsigned_long local_4d68;
  unsigned_long uStack_4d60;
  size_t local_4d58;
  size_t sStack_4d50;
  float local_4d48;
  float fStack_4d44;
  float fStack_4d40;
  float fStack_4d3c;
  mvector<PrimRefMB> *local_4d30;
  mvector<SubGridBuildData> *local_4d28;
  BBox1f *local_4d20;
  long *local_4d18;
  _func_int ***local_4d10;
  undefined8 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  _func_int **local_4848;
  ulong local_4840;
  undefined1 local_4838 [9356];
  float local_23ac [2271];
  
  local_4848 = (_func_int **)0x0;
  local_4dd0 = 1;
  uVar27 = 0;
  local_4e28 = t0t1;
  local_4e10 = prims;
  local_4e08 = sgrids;
  local_4df8 = numPrimRefs;
  local_4de0 = scene;
  local_4dd8 = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar22 = (scene->geometries).size_active;
  if (sVar22 != 0) {
    uVar27 = 0;
    sVar19 = 0;
    do {
      pGVar2 = (scene->geometries).items[sVar19].ptr;
      if ((((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
          ((1 << (SUB41(pGVar2->field_8,0) & 0x1f) & types) == ~MTY_ALL)) ||
         (pGVar2->numTimeSteps == 1)) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)pGVar2->numPrimitives;
      }
      uVar27 = uVar27 + uVar15;
      sVar19 = sVar19 + 1;
    } while (sVar22 != sVar19);
  }
  local_4840 = uVar27;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar15 = uVar27 + 0x3ff >> 10;
  if ((ulong)(long)iVar10 < uVar15) {
    uVar15 = (long)iVar10;
  }
  uVar26 = 0x40;
  if (uVar15 < 0x40) {
    uVar26 = uVar15;
  }
  pp_Var29 = (_func_int **)(uVar26 + (uVar26 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  local_4848 = pp_Var29;
  if (1 < uVar15) {
    uVar26 = 0;
    uVar15 = uVar27 / (ulong)pp_Var29;
    pRVar3 = (scene->geometries).items;
    pp_Var21 = (_func_int **)0x1;
    lVar23 = 0;
    do {
      pGVar2 = pRVar3[lVar23].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
         (((1 << (SUB41(pGVar2->field_8,0) & 0x1f) & types) == ~MTY_ALL ||
          ((pGVar2->numTimeSteps == 1 || (uVar25 = (ulong)pGVar2->numPrimitives, uVar25 == 0)))))) {
        uVar25 = 0;
        lVar18 = 0;
      }
      else {
        uVar16 = ((long)pp_Var21 + 1) * uVar27;
        lVar18 = 0;
        uVar28 = 0;
        do {
          uVar11 = uVar15;
          uVar15 = uVar11;
          if ((uVar26 + uVar25 + lVar18 < uVar11) || (pp_Var29 <= pp_Var21)) break;
          local_4c48[(long)pp_Var21] = lVar23;
          uVar28 = uVar28 + (uVar11 - uVar26);
          local_4a48[(long)pp_Var21] = uVar28;
          pp_Var21 = (_func_int **)((long)pp_Var21 + 1);
          uVar15 = uVar16 / (ulong)local_4848;
          lVar18 = -uVar28;
          uVar16 = uVar16 + uVar27;
          uVar26 = uVar11;
          pp_Var29 = local_4848;
        } while (uVar28 < uVar25);
      }
      uVar26 = uVar25 + uVar26 + lVar18;
      lVar23 = lVar23 + 1;
    } while (pp_Var21 < pp_Var29);
  }
  local_4dc8 = 0x7f8000007f800000;
  uStack_4dc0 = 0x7f8000007f800000;
  local_4db8 = 0xff800000ff800000;
  uStack_4db0 = 0xff800000ff800000;
  local_4da8 = 0x7f8000007f800000;
  uStack_4da0 = 0x7f8000007f800000;
  local_4d98 = 0xff800000ff800000;
  uStack_4d90 = 0xff800000ff800000;
  local_4d88 = 0x7f8000007f800000;
  uStack_4d80 = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0;
  uStack_4d60 = 0;
  local_4d58 = 0;
  sStack_4d50 = 0;
  local_4d48 = 0.0;
  fStack_4d44 = 1.0;
  fStack_4d40 = 1.0;
  fStack_4d3c = 0.0;
  local_4d30 = local_4e10;
  local_4d28 = local_4e08;
  local_4d20 = &local_4e28;
  local_4e00 = &local_4de0;
  local_4d00 = &local_4e00;
  local_4cf0 = &local_4df0;
  local_4d10 = &local_4e30;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e31;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e30 = pp_Var29;
  local_4df0 = &local_4d30;
  local_4de8 = local_4e00;
  local_4d08 = &local_4dc8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e18.m_version_and_traits = 0;
  local_4e20 = &local_4d18;
  ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e18,0xc0);
  ptVar12->m_reserved[3] = 0;
  ptVar12->m_reserved[4] = 0;
  ptVar12->m_reserved[1] = 0;
  ptVar12->m_reserved[2] = 0;
  (ptVar12->super_task_traits).m_version_and_traits = 0;
  ptVar12->m_reserved[0] = 0;
  ptVar12->m_reserved[5] = 0;
  ptVar12->_vptr_task = (_func_int **)&PTR__task_0218a158;
  ptVar12[1]._vptr_task = pp_Var29;
  ptVar12[1].super_task_traits.m_version_and_traits = 0;
  ptVar12[1].m_reserved[0] = 1;
  ptVar12[1].m_reserved[1] = (uint64_t)&local_4e20;
  ptVar12[1].m_reserved[2] = 0;
  ptVar12[1].m_reserved[3] = 1;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  *(undefined4 *)&ptVar12[2]._vptr_task = 0;
  *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
  ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
  ptVar12[2].super_task_traits.m_version_and_traits = local_4e18.m_version_and_traits;
  local_4ce8 = 0;
  local_4ce0 = 1;
  local_4cd8.m_version_and_traits = 1;
  local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
  tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar9 != '\0') {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"task cancelled");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar31._8_8_ = uStack_4dc0;
  aVar31._0_8_ = local_4dc8;
  aVar32._8_8_ = uStack_4db0;
  aVar32._0_8_ = local_4db8;
  aVar34._8_8_ = uStack_4da0;
  aVar34._0_8_ = local_4da8;
  aVar36._8_8_ = uStack_4d90;
  aVar36._0_8_ = local_4d98;
  aVar38._8_8_ = uStack_4d80;
  aVar38._0_8_ = local_4d88;
  aVar40._8_8_ = uStack_4d70;
  aVar40._0_8_ = local_4d78;
  (__return_storage_ptr__->object_range)._begin = local_4d68;
  (__return_storage_ptr__->object_range)._end = uStack_4d60;
  BVar45.upper = fStack_4d44;
  BVar45.lower = local_4d48;
  BVar8.upper = fStack_4d3c;
  BVar8.lower = fStack_4d40;
  __return_storage_ptr__->max_time_range = BVar45;
  __return_storage_ptr__->time_range = BVar8;
  __return_storage_ptr__->num_time_segments = local_4d58;
  __return_storage_ptr__->max_num_time_segments = sStack_4d50;
  uVar13 = uStack_4d60;
  uVar17 = local_4d68;
  if (local_4e30 != (_func_int **)0x0) {
    sVar22 = __return_storage_ptr__->num_time_segments;
    sVar19 = __return_storage_ptr__->max_num_time_segments;
    pauVar24 = (undefined1 (*) [16])local_4838;
    BVar45 = __return_storage_ptr__->max_time_range;
    pp_Var29 = local_4e30;
    fVar4 = (__return_storage_ptr__->time_range).upper;
    fVar42 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar15 = *(ulong *)(pauVar24[7] + 8);
      uVar27 = *(ulong *)pauVar24[8];
      fVar1 = *(float *)(pauVar24[8] + 0xc);
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x240) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x241) = aVar32;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x242) = aVar34;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x243) = aVar36;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x244) = aVar38;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar24 + 0x245) = aVar40;
      aVar31.m128 = (__m128)minps(aVar31.m128,*pauVar24);
      aVar32.m128 = (__m128)maxps(aVar32.m128,pauVar24[1]);
      aVar34.m128 = (__m128)minps(aVar34.m128,pauVar24[2]);
      aVar36.m128 = (__m128)maxps(aVar36.m128,pauVar24[3]);
      aVar38.m128 = (__m128)minps(aVar38.m128,pauVar24[4]);
      aVar40.m128 = (__m128)maxps(aVar40.m128,pauVar24[5]);
      fVar43 = fVar42;
      if (*(float *)(pauVar24[8] + 8) <= fVar42) {
        fVar43 = *(float *)(pauVar24[8] + 8);
      }
      uVar17 = uVar17 + *(long *)pauVar24[6];
      uVar13 = uVar13 + *(long *)(pauVar24[6] + 8);
      sVar22 = sVar22 + *(long *)pauVar24[7];
      uVar5 = (__return_storage_ptr__->object_range)._begin;
      uVar6 = (__return_storage_ptr__->object_range)._end;
      sVar7 = __return_storage_ptr__->max_num_time_segments;
      *(size_t *)pauVar24[0x247] = __return_storage_ptr__->num_time_segments;
      *(size_t *)(pauVar24[0x247] + 8) = sVar7;
      *(unsigned_long *)pauVar24[0x246] = uVar5;
      *(unsigned_long *)(pauVar24[0x246] + 8) = uVar6;
      *(BBox1f *)(pauVar24 + 0x248) = BVar45;
      *(float *)(pauVar24[0x248] + 8) = fVar42;
      *(float *)(pauVar24[0x248] + 0xc) = fVar4;
      bVar30 = sVar19 < uVar15;
      if (sVar19 <= uVar15) {
        sVar19 = uVar15;
      }
      if (fVar1 <= fVar4) {
        fVar1 = fVar4;
      }
      uVar15 = CONCAT44((int)((uint)bVar30 << 0x1f) >> 0x1f,(int)((uint)bVar30 << 0x1f) >> 0x1f);
      BVar45 = (BBox1f)(~uVar15 & (ulong)BVar45 | uVar27 & uVar15);
      (__return_storage_ptr__->object_range)._begin = uVar17;
      (__return_storage_ptr__->object_range)._end = uVar13;
      __return_storage_ptr__->num_time_segments = sVar22;
      __return_storage_ptr__->max_num_time_segments = sVar19;
      pauVar24 = pauVar24 + 9;
      pp_Var29 = (_func_int **)((long)pp_Var29 + -1);
      fVar4 = fVar1;
      fVar42 = fVar43;
    } while (pp_Var29 != (_func_int **)0x0);
    __return_storage_ptr__->max_time_range = BVar45;
    (__return_storage_ptr__->time_range).lower = fVar43;
    (__return_storage_ptr__->time_range).upper = fVar1;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar32;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar36;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar40;
  if (uVar13 - uVar17 != local_4df8) {
    (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
    pp_Var29 = local_4848;
    local_4dc8 = 0x7f8000007f800000;
    uStack_4dc0 = 0x7f8000007f800000;
    local_4db8 = 0xff800000ff800000;
    uStack_4db0 = 0xff800000ff800000;
    local_4da8 = 0x7f8000007f800000;
    uStack_4da0 = 0x7f8000007f800000;
    local_4d98 = 0xff800000ff800000;
    uStack_4d90 = 0xff800000ff800000;
    local_4d88 = 0x7f8000007f800000;
    uStack_4d80 = 0x7f8000007f800000;
    local_4d78 = 0xff800000ff800000;
    uStack_4d70 = 0xff800000ff800000;
    local_4d68 = 0;
    uStack_4d60 = 0;
    local_4d58 = 0;
    sStack_4d50 = 0;
    local_4d48 = 0.0;
    fStack_4d44 = 1.0;
    fStack_4d40 = 1.0;
    fStack_4d3c = 0.0;
    local_4d30 = local_4e10;
    local_4d28 = local_4e08;
    local_4d20 = &local_4e28;
    local_4e00 = &local_4de0;
    local_4e30 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e30;
    local_4d00 = &local_4e00;
    local_4cf8 = &local_4e31;
    local_4cf0 = &local_4df0;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4df0 = &local_4d30;
    local_4de8 = local_4e00;
    local_4d08 = &local_4dc8;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e20 = &local_4d18;
    if (pp_Var29 != (_func_int **)0x0) {
      local_4e18.m_version_and_traits = 0;
      ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e18,0xc0);
      ptVar12->m_reserved[3] = 0;
      ptVar12->m_reserved[4] = 0;
      ptVar12->m_reserved[1] = 0;
      ptVar12->m_reserved[2] = 0;
      (ptVar12->super_task_traits).m_version_and_traits = 0;
      ptVar12->m_reserved[0] = 0;
      ptVar12->m_reserved[5] = 0;
      ptVar12->_vptr_task = (_func_int **)&PTR__task_0218a1a0;
      ptVar12[1]._vptr_task = pp_Var29;
      ptVar12[1].super_task_traits.m_version_and_traits = 0;
      ptVar12[1].m_reserved[0] = 1;
      ptVar12[1].m_reserved[1] = (uint64_t)&local_4e20;
      ptVar12[1].m_reserved[2] = 0;
      ptVar12[1].m_reserved[3] = 1;
      iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar12[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
      ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
      ptVar12[2].super_task_traits.m_version_and_traits = local_4e18.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar9 != '\0') {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar14,"task cancelled");
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar44._8_8_ = uStack_4dc0;
    aVar44._0_8_ = local_4dc8;
    aVar41._8_8_ = uStack_4db0;
    aVar41._0_8_ = local_4db8;
    aVar39._8_8_ = uStack_4da0;
    aVar39._0_8_ = local_4da8;
    aVar37._8_8_ = uStack_4d90;
    aVar37._0_8_ = local_4d98;
    aVar35._8_8_ = uStack_4d80;
    aVar35._0_8_ = local_4d88;
    aVar33._8_8_ = uStack_4d70;
    aVar33._0_8_ = local_4d78;
    BVar46.upper = fStack_4d44;
    BVar46.lower = local_4d48;
    if (local_4e30 != (_func_int **)0x0) {
      pfVar20 = local_23ac;
      do {
        uVar27 = *(ulong *)(pfVar20 + -0x905);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0x23) = aVar44;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0x1f) = aVar41;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0x1b) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0x17) = aVar37;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0x13) = aVar35;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar20 + -0xf) = aVar33;
        *(unsigned_long *)(pfVar20 + -0xb) = local_4d68;
        *(unsigned_long *)(pfVar20 + -9) = uStack_4d60;
        *(size_t *)(pfVar20 + -7) = local_4d58;
        *(size_t *)(pfVar20 + -5) = sStack_4d50;
        *(BBox1f *)(pfVar20 + -3) = BVar46;
        pfVar20[-1] = fStack_4d40;
        *pfVar20 = fStack_4d3c;
        aVar44.m128 = (__m128)minps(aVar44.m128,*(undefined1 (*) [16])(pfVar20 + -0x923));
        aVar41.m128 = (__m128)maxps(aVar41.m128,*(undefined1 (*) [16])(pfVar20 + -0x91f));
        aVar39.m128 = (__m128)minps(aVar39.m128,*(undefined1 (*) [16])(pfVar20 + -0x91b));
        aVar37.m128 = (__m128)maxps(aVar37.m128,*(undefined1 (*) [16])(pfVar20 + -0x917));
        aVar35.m128 = (__m128)minps(aVar35.m128,*(undefined1 (*) [16])(pfVar20 + -0x913));
        aVar33.m128 = (__m128)maxps(aVar33.m128,*(undefined1 (*) [16])(pfVar20 + -0x90f));
        if (pfVar20[-0x901] <= fStack_4d40) {
          fStack_4d40 = pfVar20[-0x901];
        }
        local_4d68 = local_4d68 + *(long *)(pfVar20 + -0x90b);
        uStack_4d60 = uStack_4d60 + *(long *)(pfVar20 + -0x909);
        fVar4 = pfVar20[-0x900];
        if (pfVar20[-0x900] <= fStack_4d3c) {
          fVar4 = fStack_4d3c;
        }
        local_4d58 = local_4d58 + *(long *)(pfVar20 + -0x907);
        bVar30 = sStack_4d50 < uVar27;
        if (sStack_4d50 <= uVar27) {
          sStack_4d50 = uVar27;
        }
        uVar27 = CONCAT44((int)((uint)bVar30 << 0x1f) >> 0x1f,(int)((uint)bVar30 << 0x1f) >> 0x1f);
        BVar46 = (BBox1f)(~uVar27 & (ulong)BVar46 | *(ulong *)(pfVar20 + -0x903) & uVar27);
        pfVar20 = pfVar20 + 0x24;
        local_4e30 = (_func_int **)((long)local_4e30 + -1);
        fStack_4d3c = fVar4;
      } while (local_4e30 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar44;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar41;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar37;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar35;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar33;
    (__return_storage_ptr__->object_range)._begin = local_4d68;
    (__return_storage_ptr__->object_range)._end = uStack_4d60;
    __return_storage_ptr__->num_time_segments = local_4d58;
    __return_storage_ptr__->max_num_time_segments = sStack_4d50;
    __return_storage_ptr__->max_time_range = BVar46;
    (__return_storage_ptr__->time_range).lower = fStack_4d40;
  }
  __return_storage_ptr__->time_range = local_4e28;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
         return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }